

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_create_all_obj(command_conflict *cmd)

{
  _Bool _Var1;
  object_kind *kind_00;
  object *obj_00;
  object *obj;
  object_kind *kind;
  wchar_t i;
  command_conflict *cmd_local;
  
  for (kind._4_4_ = 0; kind._4_4_ < (int)(uint)z_info->k_max; kind._4_4_ = kind._4_4_ + 1) {
    kind_00 = k_info + kind._4_4_;
    if (((kind_00->base != (object_base_conflict *)0x0) && (kind_00->base->name != (char *)0x0)) &&
       (_Var1 = flag_has_dbg(kind_00->kind_flags,2,4,"kind->kind_flags","KF_INSTA_ART"), !_Var1)) {
      obj_00 = wiz_create_object_from_kind(kind_00);
      wiz_drop_object(obj_00);
    }
  }
  return;
}

Assistant:

void do_cmd_wiz_create_all_obj(struct command *cmd)
{
	int i;

	for (i = 0; i < z_info->k_max; i++) {
		struct object_kind *kind = &k_info[i];
		struct object *obj;

		if (kind->base == NULL || kind->base->name == NULL) continue;
		if (kf_has(kind->kind_flags, KF_INSTA_ART)) continue;

		obj = wiz_create_object_from_kind(kind);
		wiz_drop_object(obj);
	}
}